

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPTP.cpp
# Opt level: O0

TermList __thiscall Parse::TPTP::createTypeConApplication(TPTP *this,string *name,uint arity)

{
  TermList TVar1;
  bool bVar2;
  Elem EVar3;
  TermList *pTVar4;
  TermList TVar5;
  char *pcVar6;
  RangeIterator<unsigned_int> RVar7;
  TermList sort;
  TermList term;
  Elem i;
  StlIter __end1;
  StlIter __begin1;
  IterTraits<Lib::RangeIterator<unsigned_int>_> *__range1;
  TermList *args;
  uint typeCon;
  bool added;
  TermList s;
  Term *in_stack_fffffffffffffed8;
  StlIter *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  uint in_stack_fffffffffffffeec;
  TermList in_stack_fffffffffffffef0;
  undefined4 in_stack_ffffffffffffff04;
  TermList in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff28;
  TermList in_stack_ffffffffffffff30;
  TermList local_c0;
  uint64_t local_b8;
  Elem local_ac;
  RangeIterator<unsigned_int> local_88;
  undefined8 local_78;
  uint uVar8;
  undefined4 in_stack_ffffffffffffff94;
  undefined8 *puVar9;
  bool *in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffbc;
  string *in_stack_ffffffffffffffc0;
  Signature *in_stack_ffffffffffffffc8;
  uint64_t local_8;
  
  Kernel::Signature::addTypeCon
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
             in_stack_ffffffffffffffb0);
  pTVar4 = nLastTermLists((TPTP *)in_stack_fffffffffffffef0._content,in_stack_fffffffffffffeec);
  RVar7 = (RangeIterator<unsigned_int>)
          Lib::$_0::operator()
                    ((anon_class_1_0_00000001 *)in_stack_ffffffffffffff30._content,
                     (int)((ulong)in_stack_ffffffffffffff28 >> 0x20),(uint)in_stack_ffffffffffffff28
                    );
  local_88._to = RVar7._to;
  local_88._0_8_ = RVar7._0_8_;
  local_78._0_4_ = local_88._next;
  local_78._4_4_ = local_88._from;
  puVar9 = &local_78;
  uVar8 = local_88._to;
  local_88 = RVar7;
  Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>::begin
            ((IterTraits<Lib::RangeIterator<unsigned_int>_> *)in_stack_fffffffffffffed8);
  Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>::end
            ((IterTraits<Lib::RangeIterator<unsigned_int>_> *)in_stack_fffffffffffffed8);
  while( true ) {
    bVar2 = Lib::operator!=(in_stack_fffffffffffffee0,(StlIter *)in_stack_fffffffffffffed8);
    in_stack_ffffffffffffff04 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff04);
    if (!bVar2) {
      Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>::StlIter::~StlIter((StlIter *)0xa87433);
      Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>::StlIter::~StlIter((StlIter *)0xa87440);
      Kernel::AtomicSort::create
                ((uint)((ulong)puVar9 >> 0x20),(uint)puVar9,
                 (TermList *)CONCAT44(in_stack_ffffffffffffff94,uVar8));
      Kernel::TermList::TermList((TermList *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      Lib::Stack<Kernel::TermList>::pop
                ((Stack<Kernel::TermList> *)in_stack_fffffffffffffef0._content,
                 in_stack_fffffffffffffeec);
      return (TermList)local_8;
    }
    EVar3 = Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>::StlIter::operator*
                      ((StlIter *)0xa87484);
    local_b8 = pTVar4[EVar3]._content;
    local_ac = EVar3;
    TVar5 = sortOf((TPTP *)CONCAT44(in_stack_ffffffffffffff04,EVar3),in_stack_ffffffffffffff08);
    local_c0 = TVar5;
    in_stack_fffffffffffffef0 = Kernel::AtomicSort::superSort();
    bVar2 = Kernel::TermList::operator!=(&local_c0,(TermList *)&stack0xffffffffffffff30);
    in_stack_fffffffffffffeec = CONCAT13(bVar2,(int3)in_stack_fffffffffffffeec);
    if (bVar2) break;
    Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>::StlIter::operator++
              ((StlIter *)CONCAT44(in_stack_ffffffffffffff04,EVar3));
  }
  pcVar6 = (char *)__cxa_allocate_exception(0x50);
  TVar1._content._4_4_ = in_stack_ffffffffffffff04;
  TVar1._content._0_4_ = EVar3;
  Lib::UserErrorException::
  Exception<char_const*,Kernel::TermList,Lib::UserErrorException::Exception,char_const*,Lib::UserErrorException::Exception>
            ((UserErrorException *)in_stack_fffffffffffffef0._content,
             (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),TVar1,pcVar6,
             TVar5,(char *)in_stack_fffffffffffffed8);
  __cxa_throw(pcVar6,&Lib::UserErrorException::typeinfo,Lib::UserErrorException::~UserErrorException
             );
}

Assistant:

TermList TPTP::createTypeConApplication(std::string name, unsigned arity)
{ 
  ASS_GE(_termLists.size(), arity);

  bool added = false;
  unsigned typeCon = env.signature->addTypeCon(name,arity,added);
  if(added)
    USER_ERROR("Undeclared type constructor ", name, "/", arity);

  auto args = nLastTermLists(arity);
  for (auto i : range(0, arity)) {
    auto term = args[i];
    auto sort = sortOf(term);
    if (sort != AtomicSort::superSort()) 
        USER_ERROR("The sort ", sort, " of type argument ", term, " is not $tType as mandated by TF1");
  }
  auto s = TermList(AtomicSort::create(typeCon, arity, args));
  _termLists.pop(arity);
  return s;
}